

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_radio_text(nk_context *ctx,char *text,int len,nk_bool *active)

{
  int is_active;
  uint uVar1;
  nk_bool nVar2;
  
  uVar1 = 0;
  if (active != (nk_bool *)0x0 && (text != (char *)0x0 && ctx != (nk_context *)0x0)) {
    is_active = *active;
    nVar2 = nk_option_text(ctx,text,len,is_active);
    *active = nVar2;
    uVar1 = (uint)(is_active != nVar2);
  }
  return uVar1;
}

Assistant:

NK_API nk_bool
nk_radio_text(struct nk_context *ctx, const char *text, int len, nk_bool *active)
{
int old_value;
NK_ASSERT(ctx);
NK_ASSERT(text);
NK_ASSERT(active);
if (!ctx || !text || !active) return 0;
old_value = *active;
*active = nk_option_text(ctx, text, len, old_value);
return old_value != *active;
}